

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanDynamicHeap.cpp
# Opt level: O2

VulkanDynamicAllocation * __thiscall
Diligent::VulkanDynamicHeap::Allocate
          (VulkanDynamicAllocation *__return_storage_ptr__,VulkanDynamicHeap *this,
          Uint32 SizeInBytes,Uint32 Alignment)

{
  unsigned_long val;
  type tVar1;
  undefined4 in_register_0000000c;
  char (*Args_1) [80];
  uint uVar2;
  OffsetType val_00;
  char (*in_R8) [21];
  uint uVar3;
  ulong uVar4;
  ulong SizeInBytes_00;
  MasterBlock MVar5;
  Uint32 Alignment_local;
  string msg;
  MasterBlock MasterBlock;
  
  Alignment_local = Alignment;
  if (Alignment == 0) {
    FormatString<char[26],char[14]>
              (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x66d707,
               (char (*) [14])CONCAT44(in_register_0000000c,Alignment));
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Allocate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanDynamicHeap.cpp"
               ,0xe1);
    std::__cxx11::string::~string((string *)&msg);
LAB_0025742e:
    FormatString<char[12],unsigned_int,char[21]>
              (&msg,(Diligent *)"Alignment (",(char (*) [12])&Alignment_local,
               (uint *)") must be power of 2",in_R8);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Allocate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanDynamicHeap.cpp"
               ,0xe2);
    std::__cxx11::string::~string((string *)&msg);
  }
  else if ((Alignment & Alignment - 1) != 0) goto LAB_0025742e;
  uVar3 = this->m_MasterBlockSize;
  Args_1 = (char (*) [80])(ulong)(uVar3 >> 1);
  SizeInBytes_00 = (ulong)SizeInBytes;
  if (uVar3 >> 1 < SizeInBytes) {
    MVar5 = VulkanDynamicMemoryManager::AllocateMasterBlock
                      (this->m_GlobalDynamicMemMgr,SizeInBytes_00,(ulong)Alignment_local);
    uVar4 = MVar5.Size;
    val = MVar5.UnalignedOffset;
    MasterBlock = MVar5;
    if (val == 0xffffffffffffffff) {
      tVar1 = 0xffffffffffffffff;
      uVar4 = 0;
    }
    else {
      tVar1 = AlignUp<unsigned_long,unsigned_long>(val,(ulong)Alignment_local);
      if (uVar4 < (tVar1 + SizeInBytes_00) - val) {
        FormatString<char[26],char[80]>
                  (&msg,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])
                   "MasterBlock.Size >= SizeInBytes + (AlignedOffset - MasterBlock.UnalignedOffset)"
                   ,Args_1);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"Allocate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanDynamicHeap.cpp"
                   ,0xee);
        std::__cxx11::string::~string((string *)&msg);
      }
      this->m_CurrAllocatedSize = this->m_CurrAllocatedSize + (int)MVar5.Size;
      std::
      vector<Diligent::VariableSizeAllocationsManager::Allocation,std::allocator<Diligent::VariableSizeAllocationsManager::Allocation>>
      ::emplace_back<Diligent::VariableSizeAllocationsManager::Allocation&>
                ((vector<Diligent::VariableSizeAllocationsManager::Allocation,std::allocator<Diligent::VariableSizeAllocationsManager::Allocation>>
                  *)&this->m_MasterBlocks,&MasterBlock);
    }
  }
  else {
    if (this->m_CurrOffset == 0xffffffffffffffff) {
LAB_00257561:
      msg._0_16_ = VulkanDynamicMemoryManager::AllocateMasterBlock
                             (this->m_GlobalDynamicMemMgr,(ulong)uVar3,0);
      if (msg._M_dataplus._M_p != 0xffffffffffffffff) {
        this->m_CurrOffset = msg._M_dataplus._M_p;
        this->m_CurrAllocatedSize = this->m_CurrAllocatedSize + (Uint32)msg._M_string_length;
        this->m_AvailableSize = (Uint32)msg._M_string_length;
        std::
        vector<Diligent::VariableSizeAllocationsManager::Allocation,std::allocator<Diligent::VariableSizeAllocationsManager::Allocation>>
        ::emplace_back<Diligent::VariableSizeAllocationsManager::Allocation&>
                  ((vector<Diligent::VariableSizeAllocationsManager::Allocation,std::allocator<Diligent::VariableSizeAllocationsManager::Allocation>>
                    *)&this->m_MasterBlocks,(Allocation *)&msg);
      }
      val_00 = this->m_CurrOffset;
    }
    else {
      tVar1 = AlignUp<unsigned_long,unsigned_long>(this->m_CurrOffset,(ulong)Alignment_local);
      val_00 = this->m_CurrOffset;
      if ((ulong)this->m_AvailableSize < (tVar1 + SizeInBytes_00) - val_00) {
        uVar3 = this->m_MasterBlockSize;
        goto LAB_00257561;
      }
    }
    if (val_00 == 0xffffffffffffffff) goto LAB_00257695;
    tVar1 = AlignUp<unsigned_long,unsigned_long>(val_00,(ulong)Alignment_local);
    uVar4 = (tVar1 - this->m_CurrOffset) + SizeInBytes_00;
    if (this->m_AvailableSize < uVar4) goto LAB_00257695;
    this->m_AvailableSize = this->m_AvailableSize - (int)uVar4;
    this->m_CurrOffset = SizeInBytes_00 + tVar1;
  }
  if (tVar1 != 0xffffffffffffffff) {
    uVar3 = (int)uVar4 + this->m_CurrAlignedSize;
    this->m_CurrAlignedSize = uVar3;
    uVar2 = SizeInBytes + this->m_CurrUsedSize;
    this->m_CurrUsedSize = uVar2;
    if (uVar3 < this->m_PeakAlignedSize) {
      uVar3 = this->m_PeakAlignedSize;
    }
    if (uVar2 < this->m_PeakUsedSize) {
      uVar2 = this->m_PeakUsedSize;
    }
    this->m_PeakAlignedSize = uVar3;
    this->m_PeakUsedSize = uVar2;
    uVar3 = this->m_CurrAllocatedSize;
    if (this->m_CurrAllocatedSize < this->m_PeakAllocatedSize) {
      uVar3 = this->m_PeakAllocatedSize;
    }
    this->m_PeakAllocatedSize = uVar3;
    if (((uint)tVar1 & Alignment_local - 1) != 0) {
      FormatString<char[26],char[39]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"(AlignedOffset & (Alignment - 1)) == 0",(char (*) [39])(ulong)uVar3
                );
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"Allocate",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanDynamicHeap.cpp"
                 ,0x118);
      std::__cxx11::string::~string((string *)&msg);
    }
    __return_storage_ptr__->pDynamicMemMgr = this->m_GlobalDynamicMemMgr;
    __return_storage_ptr__->AlignedOffset = tVar1;
    __return_storage_ptr__->Size = SizeInBytes_00;
    __return_storage_ptr__->dvpFrameNumber = 0;
    return __return_storage_ptr__;
  }
LAB_00257695:
  __return_storage_ptr__->Size = 0;
  __return_storage_ptr__->dvpFrameNumber = 0;
  __return_storage_ptr__->pDynamicMemMgr = (VulkanDynamicMemoryManager *)0x0;
  __return_storage_ptr__->AlignedOffset = 0;
  return __return_storage_ptr__;
}

Assistant:

VulkanDynamicAllocation VulkanDynamicHeap::Allocate(Uint32 SizeInBytes, Uint32 Alignment)
{
    VERIFY_EXPR(Alignment > 0);
    VERIFY(IsPowerOfTwo(Alignment), "Alignment (", Alignment, ") must be power of 2");

    auto       AlignedOffset = InvalidOffset;
    OffsetType AlignedSize   = 0;
    if (SizeInBytes > m_MasterBlockSize / 2)
    {
        // Allocate directly from the memory manager
        auto MasterBlock = m_GlobalDynamicMemMgr.AllocateMasterBlock(SizeInBytes, Alignment);
        if (MasterBlock.IsValid())
        {
            AlignedOffset = AlignUp(MasterBlock.UnalignedOffset, size_t{Alignment});
            AlignedSize   = MasterBlock.Size;
            VERIFY_EXPR(MasterBlock.Size >= SizeInBytes + (AlignedOffset - MasterBlock.UnalignedOffset));
            m_CurrAllocatedSize += static_cast<Uint32>(MasterBlock.Size);
            m_MasterBlocks.emplace_back(MasterBlock);
        }
    }
    else
    {
        if (m_CurrOffset == InvalidOffset || SizeInBytes + (AlignUp(m_CurrOffset, size_t{Alignment}) - m_CurrOffset) > m_AvailableSize)
        {
            auto MasterBlock = m_GlobalDynamicMemMgr.AllocateMasterBlock(m_MasterBlockSize, 0);
            if (MasterBlock.IsValid())
            {
                m_CurrOffset = MasterBlock.UnalignedOffset;
                m_CurrAllocatedSize += static_cast<Uint32>(MasterBlock.Size);
                m_AvailableSize = static_cast<Uint32>(MasterBlock.Size);
                m_MasterBlocks.emplace_back(MasterBlock);
            }
        }

        if (m_CurrOffset != InvalidOffset)
        {
            AlignedOffset = AlignUp(m_CurrOffset, size_t{Alignment});
            AlignedSize   = SizeInBytes + (AlignedOffset - m_CurrOffset);
            if (AlignedSize <= m_AvailableSize)
            {
                m_AvailableSize -= static_cast<Uint32>(AlignedSize);
                m_CurrOffset += static_cast<Uint32>(AlignedSize);
            }
            else
                AlignedOffset = InvalidOffset;
        }
    }

    // Every device context uses its own dynamic heap, so there is no need to lock
    if (AlignedOffset != InvalidOffset)
    {
        m_CurrAlignedSize += static_cast<Uint32>(AlignedSize);
        m_CurrUsedSize += SizeInBytes;
        m_PeakAlignedSize   = std::max(m_PeakAlignedSize, m_CurrAlignedSize);
        m_PeakUsedSize      = std::max(m_PeakUsedSize, m_CurrUsedSize);
        m_PeakAllocatedSize = std::max(m_PeakAllocatedSize, m_CurrAllocatedSize);

        VERIFY_EXPR((AlignedOffset & (Alignment - 1)) == 0);
        return VulkanDynamicAllocation{m_GlobalDynamicMemMgr, AlignedOffset, SizeInBytes};
    }
    else
        return VulkanDynamicAllocation{};
}